

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

void __thiscall
crnlib::
hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
::raw_node::raw_node(raw_node *this,raw_node *other)

{
  value_type *in_RSI;
  long in_RDI;
  node *pSrc;
  node *pDst;
  value_type *in_stack_ffffffffffffffd8;
  
  if (in_RSI->field_0x1c == '\0') {
    *(undefined1 *)(in_RDI + 0x1c) = 0;
  }
  else {
    hash_map<crnlib::qdxt1::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt1::cluster_id>,_crnlib::equal_to<crnlib::qdxt1::cluster_id>_>
    ::construct_value_type(in_RSI,in_stack_ffffffffffffffd8);
    *(undefined1 *)(in_RDI + 0x1c) = 1;
  }
  return;
}

Assistant:

inline raw_node(const raw_node& other) {
      node* pDst = reinterpret_cast<node*>(this);
      const node* pSrc = reinterpret_cast<const node*>(&other);

      if (pSrc->state) {
        hash_map_type::construct_value_type(pDst, pSrc);
        pDst->state = cStateValid;
      } else
        pDst->state = cStateInvalid;
    }